

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O1

void TestFastDtoaShortestVariousFloats(void)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff78;
  undefined8 uVar6;
  int local_80;
  undefined1 local_7c [4];
  short local_78;
  undefined1 uStack_76;
  undefined1 uStack_75;
  short sStack_74;
  undefined1 uStack_72;
  undefined1 uStack_71;
  char local_70;
  
  buffer._8_8_ = local_7c;
  buffer.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,1.401298464324817e-45,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0x87;
    goto LAB_00862f08;
  }
  if (local_78 != 0x31) {
    pcVar2 = "\"1\"";
    pcVar4 = "1";
    uVar3 = 0x88;
    goto LAB_00862ff4;
  }
  if (local_80 != -0x2c) {
    uVar6 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "-44";
    uVar3 = 0x89;
    uVar5 = 0xffffffd4;
    goto LAB_0086302a;
  }
  buffer_00._8_8_ = local_7c;
  buffer_00.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,3.4028234663852886e+38,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer_00,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0x8f;
    goto LAB_00862f08;
  }
  if (local_70 != '\0' ||
      CONCAT17(uStack_71,
               CONCAT16(uStack_72,
                        CONCAT24(sStack_74,CONCAT13(uStack_75,CONCAT12(uStack_76,local_78))))) !=
      0x3533323832303433) {
    pcVar2 = "\"34028235\"";
    pcVar4 = "34028235";
    uVar3 = 0x90;
    goto LAB_00862ff4;
  }
  if (local_80 != 0x27) {
    uVar6 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "39";
    uVar3 = 0x91;
    uVar5 = 0x27;
    goto LAB_0086302a;
  }
  buffer_01._8_8_ = local_7c;
  buffer_01.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,4294967296.0,FAST_DTOA_SHORTEST,(int)&local_78,
                     buffer_01,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0x95;
    goto LAB_00862f08;
  }
  if (local_70 != '\0' ||
      CONCAT17(uStack_71,
               CONCAT16(uStack_72,
                        CONCAT24(sStack_74,CONCAT13(uStack_75,CONCAT12(uStack_76,local_78))))) !=
      0x3337363934393234) {
    pcVar2 = "\"42949673\"";
    pcVar4 = "42949673";
    uVar3 = 0x96;
    goto LAB_00862ff4;
  }
  if (local_80 != 10) {
    uVar6 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "10";
    uVar3 = 0x97;
    uVar5 = 10;
    goto LAB_0086302a;
  }
  buffer_02._8_8_ = local_7c;
  buffer_02.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,3.32306998946229e+35,FAST_DTOA_SHORTEST,(int)&local_78
                     ,buffer_02,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0x9b;
    goto LAB_00862f08;
  }
  if (CONCAT13(uStack_72,CONCAT21(sStack_74,uStack_75)) != 0x373033 ||
      CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)) != 0x33323333) {
    pcVar2 = "\"332307\"";
    pcVar4 = "332307";
    uVar3 = 0x9c;
    goto LAB_00862ff4;
  }
  if (local_80 != 0x24) {
    uVar6 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "36";
    uVar3 = 0x9d;
    uVar5 = 0x24;
    goto LAB_0086302a;
  }
  buffer_03._8_8_ = local_7c;
  buffer_03.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,1.2341235575308664e-41,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer_03,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0xa1;
    goto LAB_00862f08;
  }
  if (sStack_74 != 0x31 || CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)) != 0x34333231) {
    pcVar2 = "\"12341\"";
    pcVar4 = "12341";
    uVar3 = 0xa2;
    goto LAB_00862ff4;
  }
  if (local_80 != -0x28) {
    uVar6 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "-40";
    uVar3 = 0xa3;
    uVar5 = 0xffffffd8;
    goto LAB_0086302a;
  }
  buffer_04._8_8_ = local_7c;
  buffer_04.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,33554432.0,FAST_DTOA_SHORTEST,(int)&local_78,buffer_04
                     ,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0xa7;
    goto LAB_00862f08;
  }
  if (local_70 != '\0' ||
      CONCAT17(uStack_71,
               CONCAT16(uStack_72,
                        CONCAT24(sStack_74,CONCAT13(uStack_75,CONCAT12(uStack_76,local_78))))) !=
      0x3233343435353333) {
    pcVar2 = "\"33554432\"";
    pcVar4 = "33554432";
    uVar3 = 0xa8;
    goto LAB_00862ff4;
  }
  if (local_80 != 8) {
    uVar6 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "8";
    uVar3 = 0xa9;
    uVar5 = 8;
    goto LAB_0086302a;
  }
  buffer_05._8_8_ = local_7c;
  buffer_05.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,326494756798464.0,FAST_DTOA_SHORTEST,(int)&local_78,
                     buffer_05,&local_80,in_stack_ffffffffffffff78);
  if (!bVar1) {
    uVar3 = 0xad;
    goto LAB_00862f08;
  }
  if (local_70 != '\0' ||
      CONCAT17(uStack_71,
               CONCAT16(uStack_72,
                        CONCAT24(sStack_74,CONCAT13(uStack_75,CONCAT12(uStack_76,local_78))))) !=
      0x3637343934363233) {
    pcVar2 = "\"32649476\"";
    pcVar4 = "32649476";
    uVar3 = 0xae;
    goto LAB_00862ff4;
  }
  if (local_80 != 0xf) {
    uVar6 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar2 = "15";
    uVar3 = 0xaf;
    uVar5 = 0xf;
    goto LAB_0086302a;
  }
  buffer_06._8_8_ = local_7c;
  buffer_06.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,3.9113222363777194e+37,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer_06,&local_80,in_stack_ffffffffffffff78);
  if (bVar1) {
    if (local_70 != '\0' ||
        CONCAT17(uStack_71,
                 CONCAT16(uStack_72,
                          CONCAT24(sStack_74,CONCAT13(uStack_75,CONCAT12(uStack_76,local_78))))) !=
        0x3232323331313933) {
      pcVar2 = "\"39113222\"";
      pcVar4 = "39113222";
      uVar3 = 0xb4;
      goto LAB_00862ff4;
    }
    if (local_80 != 0x26) {
      uVar6 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
      pcVar2 = "38";
      uVar3 = 0xb5;
      uVar5 = 0x26;
      goto LAB_0086302a;
    }
  }
  buffer_07._8_8_ = local_7c;
  buffer_07.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,1.1754943508222875e-38,FAST_DTOA_SHORTEST,
                     (int)&local_78,buffer_07,&local_80,in_stack_ffffffffffffff78);
  if (bVar1) {
    if (local_70 != '\0' ||
        CONCAT17(uStack_71,
                 CONCAT16(uStack_72,
                          CONCAT24(sStack_74,CONCAT13(uStack_75,CONCAT12(uStack_76,local_78))))) !=
        0x3434393435373131) {
      pcVar2 = "\"11754944\"";
      pcVar4 = "11754944";
      uVar3 = 0xbc;
      goto LAB_00862ff4;
    }
    if (local_80 == -0x25) goto LAB_00862b12;
    uVar6 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar3 = 0xbd;
  }
  else {
LAB_00862b12:
    buffer_08._8_8_ = local_7c;
    buffer_08.start_ = (char *)0x64;
    bVar1 = double_conversion::FastDtoa
                      ((double_conversion *)0x1,1.1754942106924411e-38,FAST_DTOA_SHORTEST,
                       (int)&local_78,buffer_08,&local_80,in_stack_ffffffffffffff78);
    if (!bVar1) {
      uVar3 = 0xc3;
LAB_00862f08:
      printf("%s:%d:\n CHECK(%s) failed\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
             ,uVar3,"status");
      abort();
    }
    if (local_70 != '\0' ||
        CONCAT17(uStack_71,
                 CONCAT16(uStack_72,
                          CONCAT24(sStack_74,CONCAT13(uStack_75,CONCAT12(uStack_76,local_78))))) !=
        0x3234393435373131) {
      pcVar2 = "\"11754942\"";
      pcVar4 = "11754942";
      uVar3 = 0xc4;
LAB_00862ff4:
      printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
             ,uVar3,pcVar2,"buffer.start()",pcVar4,&local_78);
      abort();
    }
    if (local_80 == -0x25) {
      return;
    }
    uVar6 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar3 = 0xc5;
  }
  pcVar2 = "-37";
  uVar5 = 0xffffffdb;
LAB_0086302a:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
         ,uVar3,pcVar2,"point",uVar5,uVar6);
  abort();
}

Assistant:

TEST(FastDtoaShortestVariousFloats) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;
  bool status;

  float min_float = 1e-45f;
  status = FastDtoa(min_float, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(-44, point);


  float max_float = 3.4028234e38f;
  status = FastDtoa(max_float, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("34028235", buffer.start());
  CHECK_EQ(39, point);

  status = FastDtoa(4294967272.0f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("42949673", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(3.32306998946228968226e+35f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("332307", buffer.start());
  CHECK_EQ(36, point);

  status = FastDtoa(1.2341e-41f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("12341", buffer.start());
  CHECK_EQ(-40, point);

  status = FastDtoa(3.3554432e7, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("33554432", buffer.start());
  CHECK_EQ(8, point);

  status = FastDtoa(3.26494756798464e14f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("32649476", buffer.start());
  CHECK_EQ(15, point);

  status = FastDtoa(3.91132223637771935344e37f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  if (status) {  // Not all FastDtoa variants manage to compute this number.
    CHECK_EQ("39113222", buffer.start());
    CHECK_EQ(38, point);
  }

  uint32_t smallest_normal32 = 0x00800000;
  float v = Single(smallest_normal32).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  if (status) {
    CHECK_EQ("11754944", buffer.start());
    CHECK_EQ(-37, point);
  }

  uint32_t largest_denormal32 = 0x007FFFFF;
  v = Single(largest_denormal32).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("11754942", buffer.start());
  CHECK_EQ(-37, point);
}